

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O2

optional<int> * __thiscall
tinyusdz::crate::CrateValue::get_value<int>(optional<int> *__return_storage_ptr__,CrateValue *this)

{
  optional<int> in_RAX;
  optional<int> local_18;
  
  local_18 = in_RAX;
  tinyusdz::value::Value::get_value<int>(&local_18,&this->value_,false);
  __return_storage_ptr__->has_value_ = local_18.has_value_;
  if (local_18.has_value_ == true) {
    __return_storage_ptr__->contained = local_18.contained;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }